

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

MSize gola_new(LexState *ls,GCstr *name,uint8_t info,BCPos pc)

{
  uint uVar1;
  FuncState *pFVar2;
  VarInfo *in_RAX;
  
  pFVar2 = ls->fs;
  uVar1 = ls->vtop;
  if (uVar1 < ls->sizevstack) {
    in_RAX = ls->vstack;
  }
  else {
    gola_new_cold_1();
  }
  in_RAX[uVar1].name.gcptr64 = (uint64_t)name;
  in_RAX[uVar1].startpc = pc;
  in_RAX[uVar1].slot = (uint8_t)pFVar2->nactvar;
  in_RAX[uVar1].info = info;
  ls->vtop = uVar1 + 1;
  return uVar1;
}

Assistant:

static MSize gola_new(LexState *ls, GCstr *name, uint8_t info, BCPos pc)
{
  FuncState *fs = ls->fs;
  MSize vtop = ls->vtop;
  if (LJ_UNLIKELY(vtop >= ls->sizevstack)) {
    if (ls->sizevstack >= LJ_MAX_VSTACK)
      lj_lex_error(ls, 0, LJ_ERR_XLIMC, LJ_MAX_VSTACK);
    lj_mem_growvec(ls->L, ls->vstack, ls->sizevstack, LJ_MAX_VSTACK, VarInfo);
  }
  lj_assertFS(name == NAME_BREAK || lj_tab_getstr(fs->kt, name) != NULL,
	      "unanchored label name");
  /* NOBARRIER: name is anchored in fs->kt and ls->vstack is not a GCobj. */
  setgcref(ls->vstack[vtop].name, obj2gco(name));
  ls->vstack[vtop].startpc = pc;
  ls->vstack[vtop].slot = (uint8_t)fs->nactvar;
  ls->vstack[vtop].info = info;
  ls->vtop = vtop+1;
  return vtop;
}